

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

SQInteger __thiscall SQFuncState::GetLocalVariable(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger SVar1;
  ulong uVar2;
  SQObjectValue *pSVar3;
  
  SVar1 = (this->_vlocals)._size;
  if (0 < (long)SVar1) {
    uVar2 = SVar1 + 1;
    pSVar3 = &(this->_vlocals)._vals[SVar1 - 1]._name.super_SQObject._unVal;
    do {
      if ((((SQObject *)(pSVar3 + -1))->_type == OT_STRING) &&
         (pSVar3->pTable == (name->_unVal).pTable)) {
        return uVar2 - 2;
      }
      uVar2 = uVar2 - 1;
      pSVar3 = pSVar3 + -5;
    } while (1 < uVar2);
  }
  return -1;
}

Assistant:

inline SQUnsignedInteger size() const { return _size; }